

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O1

_Bool parse_arguments(int argc,char **argv,DISASM_OPTIONS *Options)

{
  char *Arg;
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  ulonglong uVar4;
  char *__format;
  int iVar5;
  long in_FS_OFFSET;
  uint local_3c;
  long lStack_38;
  DWORD gprIdx;
  
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 2 || argv == (char **)0x0) {
    print_help();
  }
  else {
    memset(Options,0,0x148);
    Options->Command = commandDecode;
    Options->Print = true;
    Options->Mode = '\x02';
    Options->Ring = '\x03';
    Options->Vendor = '\0';
    Options->Feature = 0xff;
    Options->SkipWriteDecoded = false;
    iVar5 = 1;
    do {
      Arg = argv[iVar5];
      _Var1 = match_gpr(Arg,&local_3c);
      if (_Var1) {
        if (iVar5 + 1 < argc) {
          uVar4 = strtoull(argv[iVar5 + 1],(char **)0x0,0);
          Options->ShemuRegs[local_3c] = uVar4;
          Options->UseShemuRegs = true;
          goto LAB_0015a67c;
        }
        __format = "No value given for %s!\n";
LAB_0015a921:
        printf(__format,Arg);
      }
      else {
        iVar3 = strcmp(Arg,"shemu");
        if (iVar3 == 0) {
          Options->Command = commandShemu;
        }
        else {
          iVar3 = strcmp(Arg,"decode");
          if (iVar3 == 0) {
            Options->Command = commandDecode;
          }
          else if (*Arg == '-') {
            if ((Arg[1] == 'f') && (Arg[2] == '\0')) {
              if (iVar5 + 1 < argc) {
                Options->InputMode = inputFile;
LAB_0015a9c9:
                iVar5 = iVar5 + 1;
                Options->FileName = argv[iVar5];
              }
            }
            else if ((Arg[1] == 'h') && (Arg[2] == '\0')) {
              if (iVar5 + 1 < argc) {
                Options->InputMode = inputHex;
                goto LAB_0015a9c9;
              }
            }
            else if ((Arg[1] == 'o') && (Arg[2] == '\0')) {
              if (iVar5 + 1 < argc) {
                uVar4 = strtoull(argv[iVar5 + 1],(char **)0x0,0);
                Options->Offset = uVar4;
LAB_0015a67c:
                iVar5 = iVar5 + 1;
              }
            }
            else if ((Arg[1] == 'r') && (Arg[2] == '\0')) {
              if (iVar5 + 1 < argc) {
                uVar4 = strtoull(argv[iVar5 + 1],(char **)0x0,0);
                Options->Rip = uVar4;
                goto LAB_0015a67c;
              }
            }
            else if ((Arg[1] == 'k') && (Arg[2] == '\0')) {
              Options->Ring = '\0';
            }
            else {
              if ((Arg[1] != 'b') || ((Arg[2] != 'w' || (Arg[3] != '\0')))) goto LAB_0015a745;
              Options->BypassSelfWrites = true;
            }
          }
          else {
LAB_0015a745:
            iVar3 = strcmp(Arg,"-b16");
            if (iVar3 == 0) {
              Options->Mode = '\0';
            }
            else {
              iVar3 = strcmp(Arg,"-b32");
              if (iVar3 == 0) {
                Options->Mode = '\x01';
              }
              else {
                iVar3 = strcmp(Arg,"-b64");
                if (iVar3 == 0) {
                  Options->Mode = '\x02';
                }
                else {
                  iVar3 = strcmp(Arg,"-v intel");
                  if (iVar3 == 0) {
                    Options->Vendor = '\x01';
                  }
                  else {
                    iVar3 = strcmp(Arg,"-v amd");
                    if (iVar3 == 0) {
                      Options->Vendor = '\x02';
                    }
                    else {
                      iVar3 = strcmp(Arg,"-v any");
                      if (iVar3 == 0) {
                        Options->Vendor = '\0';
                      }
                      else {
                        iVar3 = strcmp(Arg,"-t all");
                        if (iVar3 == 0) {
                          Options->Feature = 0xff;
                        }
                        else {
                          iVar3 = strcmp(Arg,"-t mpx");
                          if (iVar3 == 0) {
                            if (Options->Feature == 0xff) {
                              Options->Feature = '\0';
                            }
                            Options->Feature = Options->Feature | 1;
                          }
                          else {
                            iVar3 = strcmp(Arg,"-t cet");
                            if (iVar3 == 0) {
                              if (Options->Feature == 0xff) {
                                Options->Feature = '\0';
                              }
                              Options->Feature = Options->Feature | 2;
                            }
                            else {
                              iVar3 = strcmp(Arg,"-t cldm");
                              if (iVar3 == 0) {
                                if (Options->Feature == 0xff) {
                                  Options->Feature = '\0';
                                }
                                Options->Feature = Options->Feature | 4;
                              }
                              else {
                                iVar3 = strcmp(Arg,"-t piti");
                                if (iVar3 == 0) {
                                  if (Options->Feature == 0xff) {
                                    Options->Feature = '\0';
                                  }
                                  Options->Feature = Options->Feature | 8;
                                }
                                else {
                                  iVar3 = strcmp(Arg,"-t none");
                                  if (iVar3 == 0) {
                                    Options->Feature = '\0';
                                  }
                                  else {
                                    iVar3 = strcmp(Arg,"-nv");
                                    if (iVar3 == 0) {
                                      Options->Print = false;
                                    }
                                    else {
                                      iVar3 = strcmp(Arg,"-hl");
                                      if (iVar3 == 0) {
                                        Options->Highlight = true;
                                      }
                                      else {
                                        iVar3 = strcmp(Arg,"-iv");
                                        if (iVar3 == 0) {
                                          Options->Stats = true;
                                        }
                                        else {
                                          iVar3 = strcmp(Arg,"-exi");
                                          if (iVar3 == 0) {
                                            Options->ExtendedInfo = true;
                                          }
                                          else {
                                            iVar3 = strcmp(Arg,"-bits");
                                            if (iVar3 == 0) {
                                              Options->BitFields = true;
                                            }
                                            else {
                                              iVar3 = strcmp(Arg,"-skip16");
                                              if (iVar3 == 0) {
                                                Options->Skip16 = true;
                                              }
                                              else {
                                                iVar3 = strcmp(Arg,"-skip1");
                                                if (iVar3 == 0) {
                                                  Options->Skip1 = true;
                                                }
                                                else {
                                                  iVar3 = strcmp(Arg,"-skipdecoded");
                                                  if (iVar3 != 0) {
                                                    __format = "Unknown option: \'%s\'\n";
                                                    goto LAB_0015a921;
                                                  }
                                                  Options->SkipWriteDecoded = true;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
    _Var1 = parse_input(Options);
    _Var2 = true;
    if (_Var1) goto LAB_0015ab42;
    puts("Could not find a valid input!");
  }
  _Var2 = false;
LAB_0015ab42:
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_38) {
    __stack_chk_fail();
  }
  return _Var2;
}

Assistant:

_Success_(return)
bool
parse_arguments(
    _In_ int argc,
    _In_ char* argv[],
    _Out_ DISASM_OPTIONS *Options
    )
{
    int i;

    if (argc < 2 || NULL == argv)
    {
        print_help();
        return false;
    }

    memset(Options, 0, sizeof(*Options));

    // Initialize default options.
    Options->Command = commandDecode;
    Options->Mode = ND_CODE_64;
    Options->Ring = 3;
    Options->Print = true;
    Options->Vendor = ND_VEND_ANY;
    Options->Feature = ND_FEAT_ALL;
    Options->SkipWriteDecoded = false;

    i = 1;
    while (i < argc)
    {       
        DWORD gprIdx;

        if (match_gpr(argv[i], &gprIdx))
        {
            // Register value (used by shemu).
            if (i + 1 >= argc)
            {
                printf("No value given for %s!\n", argv[i]);
            }
            else
            {
                Options->ShemuRegs[gprIdx] = (size_t)strtoull(argv[i + 1], NULL, 0);
                Options->UseShemuRegs = true;
                i++;
            }
        }
        else if (strcmp(argv[i], "shemu") == 0)
        {
            // shemu command - will emulate.
            Options->Command = commandShemu;
        }
        else if (strcmp(argv[i], "decode") == 0)
        {
            // decode command.
            Options->Command = commandDecode;
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'f' && argv[i][2] == 0)
        {
            // File input mode.
            if (i + 1 < argc)
            {
                Options->InputMode = inputFile;
                Options->FileName = argv[i + 1];
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'h' && argv[i][2] == 0)
        {
            // Hex-string input mode.
            if (i + 1 < argc)
            {
                Options->InputMode = inputHex;
                Options->FileName = argv[i + 1];
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'o' && argv[i][2] == 0)
        {
            // Offset inside the provided buffer.
            if (i + 1 < argc)
            {
                Options->Offset = (size_t)strtoull(argv[i + 1], NULL, 0);
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'r' && argv[i][2] == 0)
        {
            // Rip. Can be any value, as it's used only for disassembly.
            if (i + 1 < argc)
            {
                Options->Rip = (size_t)strtoull(argv[i + 1], NULL, 0);
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'k' && argv[i][2] == 0)
        {
            // Kernel-mode for shemu.
            Options->Ring = 0;
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'b' && argv[i][2] == 'w' && argv[i][3] == 0)
        {
            // Bypass self writes in shemu.
            Options->BypassSelfWrites = true;
        }
        else if (0 == strcmp(argv[i], "-b16"))
        {
            // 16-bit mode.
            Options->Mode = ND_CODE_16;
        } 
        else if (0 == strcmp(argv[i], "-b32"))
        {
            // 32-bit mode.
            Options->Mode = ND_CODE_32;
        } 
        else if (0 == strcmp(argv[i], "-b64"))
        {
            // 64-bit mode.
            Options->Mode = ND_CODE_64;
        }
        else if (0 == strcmp(argv[i], "-v intel"))
        {
            // Prefer Intel instructions.
            Options->Vendor = ND_VEND_INTEL;
        }
        else if (0 == strcmp(argv[i], "-v amd"))
        {
            // Prefer AMD instructions.
            Options->Vendor = ND_VEND_AMD;
        }
        else if (0 == strcmp(argv[i], "-v any"))
        {
            // Try to decode everything.
            Options->Vendor = ND_VEND_ANY;
        }
        else if (0 == strcmp(argv[i], "-t all"))
        {
            // Enable all features.
            Options->Feature = ND_FEAT_ALL;
        }
        else if (0 == strcmp(argv[i], "-t mpx"))
        {
            // Enable MPX. 
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_MPX;
        }
        else if (0 == strcmp(argv[i], "-t cet"))
        {
            // Enable CET.
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_CET;
        }
        else if (0 == strcmp(argv[i], "-t cldm"))
        {
            // Enable Cache Line Demote.
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_CLDEMOTE;
        }
        else if (0 == strcmp(argv[i], "-t piti"))
        {
            // Enable Prefetch for instruction fetch.
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_PITI;
        }
        else if (0 == strcmp(argv[i], "-t none"))
        {
            // No feature support.
            Options->Feature = ND_FEAT_NONE;
        }
        else if (0 == strcmp(argv[i], "-nv"))
        {
            // Do not print anything.
            Options->Print = false;
        } 
        else if (0 == strcmp(argv[i], "-hl"))
        {
            // Highlight instruction components.
            Options->Highlight = true;
        }
        else if (0 == strcmp(argv[i], "-iv"))
        {
            // Print statistics.
            Options->Stats = true;
        }
        else if (0 == strcmp(argv[i], "-exi"))
        {
            // Print extended instruction information.
            Options->ExtendedInfo = true;
        }
        else if (0 == strcmp(argv[i], "-bits"))
        {
            // Print instruction bitfields.
            Options->BitFields = true;
        }
        else if (0 == strcmp(argv[i], "-skip16"))
        {
            // Skip 16 bytes after each decoded instruction.
            Options->Skip16 = true;
        }
        else if (0 == strcmp(argv[i], "-skip1"))
        {
            // Skip a single byte after each decoded instruction.
            Options->Skip1 = true;
        }
        else if (0 == strcmp(argv[i], "-skipdecoded"))
        {
            Options->SkipWriteDecoded = true;
        }
        else
        {
            printf("Unknown option: '%s'\n", argv[i]);
        }

        i++;
    }

    // Parse the input.
    if (!parse_input(Options))
    {
        printf("Could not find a valid input!\n");
        return false;
    }

    return true;
}